

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void __thiscall QString::QString(QString *this,QChar *unicode,qsizetype size)

{
  long lVar1;
  char16_t *pcVar2;
  QArrayDataPointer<char16_t> *in_RDX;
  QArrayDataPointer<char16_t> *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> *n;
  qsizetype in_stack_ffffffffffffffc8;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer(in_RDI);
  if (in_RSI == (QArrayDataPointer<char16_t> *)0x0) {
    QArrayDataPointer<char16_t>::clear((QArrayDataPointer<char16_t> *)0x0);
  }
  else {
    if ((long)in_RDX < 0) {
      in_RDX = (QArrayDataPointer<char16_t> *)QtPrivate::qustrlen((char16_t *)in_RDX);
    }
    if (in_RDX == (QArrayDataPointer<char16_t> *)0x0) {
      QArrayDataPointer<char16_t>::fromRawData((char16_t *)in_RSI,0);
      QArrayDataPointer<char16_t>::operator=(in_RSI,in_RDX);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDX);
    }
    else {
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(qsizetype)n,
                 (AllocationOption)((ulong)in_RSI >> 0x20));
      QArrayDataPointer<char16_t>::operator=(in_RSI,in_RDX);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDX);
      qt_noop();
      pcVar2 = QArrayDataPointer<char16_t>::data(in_RDI);
      memcpy(pcVar2,in_RSI,(long)in_RDX << 1);
      pcVar2 = QArrayDataPointer<char16_t>::data(in_RDI);
      pcVar2[(long)in_RDX] = L'\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QString::QString(const QChar *unicode, qsizetype size)
{
    if (!unicode) {
        d.clear();
    } else {
        if (size < 0)
            size = QtPrivate::qustrlen(reinterpret_cast<const char16_t *>(unicode));
        if (!size) {
            d = DataPointer::fromRawData(&_empty, 0);
        } else {
            d = DataPointer(size, size);
            Q_CHECK_PTR(d.data());
            memcpy(d.data(), unicode, size * sizeof(QChar));
            d.data()[size] = '\0';
        }
    }
}